

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server_test.c
# Opt level: O2

void test_server_tree_redirect(void)

{
  nng_err nVar1;
  int iVar2;
  nng_http_status nVar3;
  char *pcVar4;
  undefined1 local_870 [8];
  server_test st;
  void *data;
  size_t size;
  nng_http_handler *h;
  
  nVar1 = nng_http_handler_alloc_redirect
                    ((nng_http_handler **)&size,"/here",NNG_HTTP_STATUS_PERMANENT_REDIRECT,
                     "http://127.0.0.1/there");
  pcVar4 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/supplemental/http/http_server_test.c"
                         ,0x28f,"%s: expected success, got %s (%d)",
                         "nng_http_handler_alloc_redirect(&h, \"/here\", NNG_HTTP_STATUS_PERMANENT_REDIRECT, \"http://127.0.0.1/there\")"
                         ,pcVar4,nVar1);
  if (iVar2 != 0) {
    nng_http_handler_set_tree((nng_http_handler *)size);
    server_setup((server_test *)local_870,(nng_http_handler *)size);
    nVar1 = nng_http_set_uri((nng_http *)st.cli,"/here/i/go/again",(char *)0x0);
    pcVar4 = nng_strerror(nVar1);
    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/supplemental/http/http_server_test.c"
                           ,0x293,"%s: expected success, got %s (%d)",
                           "nng_http_set_uri(st.conn, \"/here/i/go/again\", NULL)",pcVar4,nVar1);
    if (iVar2 != 0) {
      nng_http_set_method((nng_http *)st.cli,"GET");
      nVar1 = httpdo((server_test *)local_870,(void **)(st.urlstr + 0x7f8),(size_t *)&data);
      pcVar4 = nng_strerror(nVar1);
      iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/supplemental/http/http_server_test.c"
                             ,0x296,"%s: expected success, got %s (%d)","httpdo(&st, &data, &size)",
                             pcVar4,nVar1);
      if (iVar2 != 0) {
        nVar3 = nng_http_get_status((nng_http *)st.cli);
        acutest_check_((uint)(nVar3 == NNG_HTTP_STATUS_PERMANENT_REDIRECT),
                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/supplemental/http/http_server_test.c"
                       ,0x297,"%s",
                       "nng_http_get_status(st.conn) == (NNG_HTTP_STATUS_PERMANENT_REDIRECT)");
        nVar3 = nng_http_get_status((nng_http *)st.cli);
        pcVar4 = nng_http_get_reason((nng_http *)st.cli);
        acutest_message_("HTTP status: expected %d (%s) got %d (%s)",0x134,
                         "NNG_HTTP_STATUS_PERMANENT_REDIRECT",(ulong)nVar3,pcVar4);
        pcVar4 = nng_http_get_header((nng_http *)st.cli,"Location");
        acutest_check_((uint)(pcVar4 != (char *)0x0),
                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/supplemental/http/http_server_test.c"
                       ,0x298,"%s","(dest = nng_http_get_header(st.conn, \"Location\")) != NULL");
        iVar2 = strcmp(pcVar4,"http://127.0.0.1/there/i/go/again");
        acutest_check_((uint)(iVar2 == 0),
                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/supplemental/http/http_server_test.c"
                       ,0x299,"%s == %s",pcVar4,"http://127.0.0.1/there/i/go/again");
        nng_free((void *)st.urlstr._2040_8_,(size_t)data);
        server_free((server_test *)local_870);
        return;
      }
    }
  }
  acutest_abort_();
}

Assistant:

static void
test_server_tree_redirect(void)
{
	const char        *dest;
	void              *data;
	size_t             size;
	nng_http_handler  *h;
	struct server_test st;

	// We'll use a permanent redirect to ensure codes carry thru
	NUTS_PASS(nng_http_handler_alloc_redirect(&h, "/here",
	    NNG_HTTP_STATUS_PERMANENT_REDIRECT, "http://127.0.0.1/there"));
	nng_http_handler_set_tree(h);
	server_setup(&st, h);

	NUTS_PASS(nng_http_set_uri(st.conn, "/here/i/go/again", NULL));
	nng_http_set_method(st.conn, "GET");

	NUTS_PASS(httpdo(&st, &data, &size));
	NUTS_HTTP_STATUS(st.conn, NNG_HTTP_STATUS_PERMANENT_REDIRECT);
	NUTS_TRUE((dest = nng_http_get_header(st.conn, "Location")) != NULL);
	NUTS_MATCH(dest, "http://127.0.0.1/there/i/go/again");
	nng_free(data, size);

	server_free(&st);
}